

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalTestNamer::getTestSourceDirectory_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  TestName *pTVar1;
  string file;
  string sStack_38;
  
  pTVar1 = getCurrentTest();
  TestName::checkBuildConfiguration((string *)&pTVar1->fileName);
  ::std::__cxx11::string::string((string *)&sStack_38,(string *)&pTVar1->fileName);
  FileUtils::getDirectory(__return_storage_ptr__,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getTestSourceDirectory() const
    {
        auto file = getCurrentTest().getFileName();
        return FileUtils::getDirectory(file);
    }